

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

EC_T_BOOL __thiscall
CAtEmLogging::OsDbgMsgHook(CAtEmLogging *this,EC_T_CHAR *szFormat,__va_list_tag *vaArgs)

{
  MSG_BUFFER_DESC *pMsgBufferDesc;
  bool bVar1;
  
  bVar1 = this->m_bDbgMsgHookEnable == 0;
  if (!bVar1) {
    pMsgBufferDesc = this->m_pAllMsgBufferDesc;
    bVar1 = true;
    if ((pMsgBufferDesc != (MSG_BUFFER_DESC *)0x0) && (pMsgBufferDesc->bIsInitialized != 0)) {
      bVar1 = false;
      InsertNewMsg(this,pMsgBufferDesc,szFormat,vaArgs,0,1);
    }
  }
  return (EC_T_BOOL)bVar1;
}

Assistant:

EC_T_BOOL CAtEmLogging::OsDbgMsgHook(const EC_T_CHAR* szFormat, EC_T_VALIST vaArgs)
{
EC_T_BOOL bPrint;

    bPrint = !m_bDbgMsgHookEnable;  // print messages outside as long as hook is not enabled
    if (m_bDbgMsgHookEnable)
    {
        if (m_pAllMsgBufferDesc != EC_NULL )
        {
            if (m_pAllMsgBufferDesc->bIsInitialized )
            {
                InsertNewMsg( m_pAllMsgBufferDesc, szFormat, vaArgs, EC_FALSE, EC_TRUE );
            }
            else
            {
                bPrint = EC_TRUE;
            }
        }
        else
        {
            bPrint = EC_TRUE;
        }
/*
        else
        {
            EC_T_CHAR   szMsg[256];

            OsVsnprintf(szMsg, 256, szFormat, vaArgs);
#ifdef VXWORKS
            logMsg( "%s", (int)szMsg, 2,3,4,5,6 );
#else
#if !(defined NOPRINTF)
            OsPrintf( "%s", szMsg );
#endif
#endif
        }
*/
    }
    return bPrint;
}